

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::emit_specialization_constants_and_structs(CompilerMSL *this)

{
  Variant *this_00;
  uint uVar1;
  Types TVar2;
  ID id;
  BaseType BVar3;
  TypedID<(spirv_cross::Types)0> *pTVar4;
  size_t sVar5;
  Variant *pVVar6;
  size_t sVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  uint32_t id_00;
  SPIRType *pSVar11;
  SPIRConstant *pSVar12;
  size_type sVar13;
  ParsedIR *pPVar14;
  SPIRUndef *pSVar15;
  SPIRConstantOp *pSVar16;
  size_type sVar17;
  mapped_type *pmVar18;
  SPIRType *pSVar19;
  byte bVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  long lVar21;
  uint32_t constant_id;
  ParsedIR *local_1b8;
  uint32_t local_1b0;
  uint local_1ac;
  string sc_type_name;
  string sc_tmp_name;
  string sc_name;
  LoopLock loop_lock;
  unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>_>
  unique_func_constants;
  string local_f8;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  declared_structs;
  SpecializationConstant wg_z;
  SpecializationConstant wg_y;
  SpecializationConstant wg_x;
  undefined1 local_88 [32];
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  aligned_structs;
  
  wg_x.id.id = 0;
  wg_y.id.id = 0;
  wg_z.id.id = 0;
  local_1b0 = Compiler::get_work_group_size_specialization_constants
                        ((Compiler *)this,&wg_x,&wg_y,&wg_z);
  declared_structs._M_h._M_buckets = &declared_structs._M_h._M_single_bucket;
  declared_structs._M_h._M_bucket_count = 1;
  declared_structs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  declared_structs._M_h._M_element_count = 0;
  declared_structs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  declared_structs._M_h._M_rehash_policy._M_next_resize = 0;
  declared_structs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  aligned_structs._M_h._M_buckets = &aligned_structs._M_h._M_single_bucket;
  aligned_structs._M_h._M_bucket_count = 1;
  aligned_structs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  aligned_structs._M_h._M_element_count = 0;
  aligned_structs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  aligned_structs._M_h._M_rehash_policy._M_next_resize = 0;
  aligned_structs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_1b8 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(local_1b8);
  pTVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[1].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[1].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  for (lVar21 = 0; sVar5 << 2 != lVar21; lVar21 = lVar21 + 4) {
    uVar1 = *(uint *)((long)&pTVar4->id + lVar21);
    if ((((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
          ptr[uVar1].type == TypeType) &&
        (pSVar11 = ParsedIR::get<spirv_cross::SPIRType>(local_1b8,uVar1),
        pSVar11->basetype == Struct)) &&
       (bVar8 = Compiler::has_extended_decoration
                          ((Compiler *)this,uVar1,SPIRVCrossDecorationBufferBlockRepacked), bVar8))
    {
      mark_scalar_layout_structs(this,pSVar11);
    }
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&unique_func_constants);
  pPVar14 = local_1b8;
  ParsedIR::create_loop_hard_lock(local_1b8);
  pTVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[3].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[3].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  bVar20 = 0;
  for (lVar21 = 0; sVar5 << 2 != lVar21; lVar21 = lVar21 + 4) {
    uVar1 = *(uint *)((long)&pTVar4->id + lVar21);
    if ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.ptr
        [uVar1].type == TypeConstant) {
      pSVar12 = ParsedIR::get<spirv_cross::SPIRConstant>(pPVar14,uVar1);
      pSVar11 = Compiler::get<spirv_cross::SPIRType>
                          ((Compiler *)this,*(uint32_t *)&(pSVar12->super_IVariant).field_0xc);
      bVar8 = Compiler::is_array((Compiler *)this,pSVar11);
      if ((bVar8) &&
         (bVar8 = Compiler::has_decoration
                            ((Compiler *)this,(ID)(pSVar11->super_IVariant).self.id,DecorationBlock)
         , bVar8)) {
        bVar8 = Compiler::is_builtin_type((Compiler *)this,pSVar11);
        bVar20 = bVar20 | bVar8;
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&unique_func_constants);
  ParsedIR::create_loop_soft_lock(pPVar14);
  ParsedIR::create_loop_hard_lock(pPVar14);
  pTVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[1].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[1].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  bVar8 = false;
  for (lVar21 = 0; sVar5 << 2 != lVar21; lVar21 = lVar21 + 4) {
    uVar1 = *(uint *)((long)&pTVar4->id + lVar21);
    if ((((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
          ptr[uVar1].type == TypeType) &&
        (pSVar11 = ParsedIR::get<spirv_cross::SPIRType>(local_1b8,uVar1),
        pSVar11->basetype == Struct)) &&
       ((pSVar11->pointer == true && (pSVar11->storage == StorageClassPhysicalStorageBuffer)))) {
      unique_func_constants._M_h._M_buckets =
           (__buckets_ptr)
           CONCAT44(unique_func_constants._M_h._M_buckets._4_4_,(pSVar11->super_IVariant).self.id);
      sVar13 = ::std::
               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count(&declared_structs._M_h,(key_type_conflict *)&unique_func_constants);
      if (sVar13 == 0) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &unique_func_constants,this,(ulong)(pSVar11->super_IVariant).self.id,1);
        CompilerGLSL::statement<char_const(&)[8],std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,(char (*) [8])"struct ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &unique_func_constants,(char (*) [2])0x2cce52);
        ::std::__cxx11::string::~string((string *)&unique_func_constants);
        unique_func_constants._M_h._M_buckets =
             (__buckets_ptr)
             CONCAT44(unique_func_constants._M_h._M_buckets._4_4_,(pSVar11->super_IVariant).self.id)
        ;
        ::std::__detail::
        _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
        ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                  *)&declared_structs,(value_type *)&unique_func_constants);
        bVar8 = true;
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&sc_type_name);
  if (bVar8) {
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2a9b09);
  }
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&declared_structs._M_h);
  unique_func_constants._M_h._M_buckets = &unique_func_constants._M_h._M_single_bucket;
  unique_func_constants._M_h._M_bucket_count = 1;
  unique_func_constants._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  unique_func_constants._M_h._M_element_count = 0;
  unique_func_constants._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  unique_func_constants._M_h._M_rehash_policy._M_next_resize = 0;
  unique_func_constants._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pTVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_constant_undef_or_type.
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_constant_undef_or_type.
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  pSVar11 = (SPIRType *)0x0;
  pPVar14 = (ParsedIR *)0x0;
  while ((ParsedIR *)(sVar5 << 2) != pPVar14) {
    uVar1 = *(uint *)((pPVar14->ids).stack_storage.aligned_char + (long)(pTVar4 + -0xe));
    pVVar6 = (this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>
             .ptr;
    this_00 = pVVar6 + uVar1;
    TVar2 = pVVar6[uVar1].type;
    local_1b8 = pPVar14;
    if (TVar2 == TypeType) {
      local_1ac = (uint)pSVar11;
      pSVar19 = Variant::get<spirv_cross::SPIRType>(this_00);
      id.id = (pSVar19->super_IVariant).self.id;
      BVar3 = pSVar19->basetype;
      sVar7 = (pSVar19->array).super_VectorView<unsigned_int>.buffer_size;
      bVar8 = pSVar19->pointer;
      bVar9 = Compiler::has_decoration((Compiler *)this,id,DecorationBlock);
      if (bVar9) {
LAB_001a2e9a:
        bVar9 = Compiler::is_builtin_type((Compiler *)this,pSVar19);
        bVar10 = !bVar9 | bVar20;
      }
      else {
        bVar9 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(pSVar19->super_IVariant).self.id,
                           DecorationBufferBlock);
        bVar10 = 1;
        if (bVar9) goto LAB_001a2e9a;
      }
      bVar10 = (((BVar3 != Struct || sVar7 != 0) | bVar8) ^ 1U) & bVar10;
      if ((this->stage_out_var_id).id != 0) {
        pSVar11 = get_stage_out_struct_type(this);
        bVar10 = bVar10 & (pSVar11->super_IVariant).self.id != id.id;
      }
      if ((this->patch_stage_out_var_id).id != 0) {
        pSVar11 = get_patch_stage_out_struct_type(this);
        bVar10 = bVar10 & (pSVar11->super_IVariant).self.id != id.id;
      }
      if ((this->stage_in_var_id).id != 0) {
        pSVar11 = get_stage_in_struct_type(this);
        bVar10 = bVar10 & (pSVar11->super_IVariant).self.id != id.id;
      }
      if ((this->patch_stage_in_var_id).id != 0) {
        pSVar11 = get_patch_stage_in_struct_type(this);
        bVar10 = bVar10 & (pSVar11->super_IVariant).self.id != id.id;
      }
      if (((this->stage_out_masked_builtin_type_id).id == id.id) || (bVar10 != 0)) {
        sc_type_name._M_dataplus._M_p._0_4_ = id.id;
        sVar13 = ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count(&declared_structs._M_h,(key_type_conflict *)&sc_type_name);
        pSVar11 = (SPIRType *)(ulong)local_1ac;
        if (sVar13 == 0) {
          if ((local_1ac & 1) != 0) {
            CompilerGLSL::statement<char_const(&)[1]>
                      (&this->super_CompilerGLSL,(char (*) [1])0x2a9b09);
          }
          sc_type_name._M_dataplus._M_p._0_4_ = id.id;
          ::std::__detail::
          _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
          ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                    *)&declared_structs,(value_type *)&sc_type_name);
          bVar8 = Compiler::has_extended_decoration
                            ((Compiler *)this,id.id,SPIRVCrossDecorationBufferBlockRepacked);
          if (bVar8) {
            align_struct(this,pSVar19,&aligned_structs);
          }
          pSVar11 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,id.id);
          CompilerGLSL::emit_struct(&this->super_CompilerGLSL,pSVar11);
          pSVar11 = (SPIRType *)0x0;
        }
      }
      else {
        pSVar11 = (SPIRType *)(ulong)local_1ac;
      }
    }
    else {
      if (TVar2 == TypeUndef) {
        pSVar15 = Variant::get<spirv_cross::SPIRUndef>(this_00);
        pSVar11 = Compiler::get<spirv_cross::SPIRType>
                            ((Compiler *)this,*(uint32_t *)&(pSVar15->super_IVariant).field_0xc);
        if (pSVar11->basetype == Void) goto LAB_001a3386;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&sc_tmp_name,this,(ulong)(pSVar15->super_IVariant).self.id,1);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                  (&sc_name,this,pSVar11,&sc_tmp_name);
        ::std::__cxx11::string::string((string *)&local_f8,"constant",(allocator *)local_88);
        inject_top_level_storage_qualifier(&sc_type_name,&sc_name,&local_f8);
        CompilerGLSL::statement<std::__cxx11::string,char_const(&)[7]>
                  (&this->super_CompilerGLSL,&sc_type_name,(char (*) [7])" = {};");
        ::std::__cxx11::string::~string((string *)&sc_type_name);
        ::std::__cxx11::string::~string((string *)&local_f8);
        ::std::__cxx11::string::~string((string *)&sc_name);
        ts_1 = &sc_tmp_name;
      }
      else {
        if (TVar2 != TypeConstantOp) {
          if (TVar2 == TypeConstant) {
            pSVar12 = Variant::get<spirv_cross::SPIRConstant>(this_00);
            if ((pSVar12->super_IVariant).self.id == local_1b0) {
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                        (&sc_type_name,this,0x19);
              pSVar12 = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,local_1b0);
              CompilerGLSL::constant_expression_abi_cxx11_
                        (&sc_name,&this->super_CompilerGLSL,pSVar12,false,false);
              ts_1 = &sc_type_name;
              CompilerGLSL::
              statement<char_const(&)[16],std::__cxx11::string,char_const(&)[21],std::__cxx11::string,char_const(&)[2]>
                        (&this->super_CompilerGLSL,(char (*) [16])"constant uint3 ",ts_1,
                         (char (*) [21])" [[maybe_unused]] = ",&sc_name,(char (*) [2])0x2cce52);
              ::std::__cxx11::string::~string((string *)&sc_name);
              goto LAB_001a2e2b;
            }
            if (pSVar12->specialization == true) {
              pSVar11 = Compiler::get<spirv_cross::SPIRType>
                                  ((Compiler *)this,
                                   *(uint32_t *)&(pSVar12->super_IVariant).field_0xc);
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                        (&sc_type_name,this,pSVar11,0);
              CompilerGLSL::add_resource_name
                        (&this->super_CompilerGLSL,(pSVar12->super_IVariant).self.id);
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (&sc_name,this,(ulong)(pSVar12->super_IVariant).self.id);
              if ((((this->msl_options).msl_version < 0x27d8) ||
                  (bVar8 = Compiler::has_decoration
                                     ((Compiler *)this,(ID)(pSVar12->super_IVariant).self.id,
                                      DecorationSpecId), !bVar8)) ||
                 (pSVar12->is_used_as_array_length != false)) {
                bVar8 = Compiler::has_decoration
                                  ((Compiler *)this,(ID)(pSVar12->super_IVariant).self.id,
                                   DecorationSpecId);
                if (bVar8) {
                  id_00 = Compiler::get_decoration
                                    ((Compiler *)this,(ID)(pSVar12->super_IVariant).self.id,
                                     DecorationSpecId);
                  CompilerGLSL::constant_value_macro_name_abi_cxx11_
                            (&sc_tmp_name,&this->super_CompilerGLSL,id_00);
                  pSVar11 = (SPIRType *)&pSVar12->specialization_constant_macro_name;
                  ::std::__cxx11::string::operator=((string *)pSVar11,(string *)&sc_tmp_name);
                  ::std::__cxx11::string::~string((string *)&sc_tmp_name);
                  CompilerGLSL::statement<char_const(&)[9],std::__cxx11::string&>
                            (&this->super_CompilerGLSL,(char (*) [9])"#ifndef ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pSVar11);
                  CompilerGLSL::constant_expression_abi_cxx11_
                            (&sc_tmp_name,&this->super_CompilerGLSL,pSVar12,false,false);
                  CompilerGLSL::
                  statement<char_const(&)[9],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string>
                            (&this->super_CompilerGLSL,(char (*) [9])"#define ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pSVar11,(char (*) [2])0x2af68c,&sc_tmp_name);
                  ::std::__cxx11::string::~string((string *)&sc_tmp_name);
                  CompilerGLSL::statement<char_const(&)[7]>
                            (&this->super_CompilerGLSL,(char (*) [7])"#endif");
                  CompilerGLSL::
                  statement<char_const(&)[10],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                            (&this->super_CompilerGLSL,(char (*) [10])"constant ",&sc_type_name,
                             (char (*) [2])0x2af68c,&sc_name,(char (*) [4])0x2c1cbd,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pSVar11,(char (*) [2])0x2cce52);
                  goto LAB_001a2e21;
                }
                CompilerGLSL::constant_expression_abi_cxx11_
                          (&sc_tmp_name,&this->super_CompilerGLSL,pSVar12,false,false);
                CompilerGLSL::
                statement<char_const(&)[10],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                          (&this->super_CompilerGLSL,(char (*) [10])"constant ",&sc_type_name,
                           (char (*) [2])0x2af68c,&sc_name,(char (*) [4])0x2c1cbd,&sc_tmp_name,
                           (char (*) [2])0x2cce52);
              }
              else {
                constant_id = Compiler::get_decoration
                                        ((Compiler *)this,(ID)(pSVar12->super_IVariant).self.id,
                                         DecorationSpecId);
                sVar17 = ::std::
                         _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::count(&unique_func_constants._M_h,&constant_id);
                if (sVar17 == 0) {
                  sc_tmp_name._M_dataplus._M_p =
                       (pointer)CONCAT44((pSVar12->super_IVariant).self.id,constant_id);
                  ::std::
                  _Hashtable<unsigned_int,std::pair<unsigned_int_const,spirv_cross::TypedID<(spirv_cross::Types)3>>,std::allocator<std::pair<unsigned_int_const,spirv_cross::TypedID<(spirv_cross::Types)3>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  ::_M_emplace<std::pair<unsigned_int,spirv_cross::TypedID<(spirv_cross::Types)0>>>
                            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,spirv_cross::TypedID<(spirv_cross::Types)3>>,std::allocator<std::pair<unsigned_int_const,spirv_cross::TypedID<(spirv_cross::Types)3>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                              *)&unique_func_constants,&sc_tmp_name);
                }
                pmVar18 = ::std::__detail::
                          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&unique_func_constants,&constant_id);
                pSVar19 = Compiler::expression_type((Compiler *)this,pmVar18->id);
                BVar3 = pSVar19->basetype;
                pmVar18 = ::std::__detail::
                          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&unique_func_constants,&constant_id);
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                          (&local_f8,this,(ulong)pmVar18->id,1);
                ::std::operator+(&sc_tmp_name,&local_f8,"_tmp");
                ::std::__cxx11::string::~string((string *)&local_f8);
                pmVar18 = ::std::__detail::
                          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&unique_func_constants,&constant_id);
                if (pmVar18->id == (pSVar12->super_IVariant).self.id) {
                  CompilerGLSL::
                  statement<char_const(&)[10],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[22],unsigned_int&,char_const(&)[5]>
                            (&this->super_CompilerGLSL,(char (*) [10])"constant ",&sc_type_name,
                             (char (*) [2])0x2af68c,&sc_tmp_name,(char (*) [22])0x2b5de7,
                             &constant_id,(char (*) [5])")]];");
                }
                CompilerGLSL::bitcast_expression
                          (&local_f8,&this->super_CompilerGLSL,pSVar11,BVar3,&sc_tmp_name);
                pSVar11 = (SPIRType *)local_88;
                CompilerGLSL::constant_expression_abi_cxx11_
                          ((string *)pSVar11,&this->super_CompilerGLSL,pSVar12,false,false);
                CompilerGLSL::
                statement<char_const(&)[10],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[33],std::__cxx11::string&,char_const(&)[5],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                          (&this->super_CompilerGLSL,(char (*) [10])"constant ",&sc_type_name,
                           (char (*) [2])0x2af68c,&sc_name,
                           (char (*) [33])" = is_function_constant_defined(",&sc_tmp_name,
                           (char (*) [5])0x2b5e6b,&local_f8,(char (*) [4])0x2d170c,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pSVar11,(char (*) [2])0x2cce52);
                ::std::__cxx11::string::~string((string *)pSVar11);
                ::std::__cxx11::string::~string((string *)&local_f8);
              }
              ::std::__cxx11::string::~string((string *)&sc_tmp_name);
              goto LAB_001a2e21;
            }
          }
          goto LAB_001a2e33;
        }
        pSVar16 = Variant::get<spirv_cross::SPIRConstantOp>(this_00);
        pSVar11 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(pSVar16->basetype).id);
        CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(pSVar16->super_IVariant).self.id)
        ;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&sc_type_name,this,(ulong)(pSVar16->super_IVariant).self.id,1);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                  (&sc_name,this,pSVar11,&sc_type_name,0);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x18])(&sc_tmp_name,this,pSVar16)
        ;
        CompilerGLSL::
        statement<char_const(&)[10],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,(char (*) [10])"constant ",&sc_name,
                   (char (*) [4])0x2c1cbd,&sc_tmp_name,(char (*) [2])0x2cce52);
        ::std::__cxx11::string::~string((string *)&sc_tmp_name);
LAB_001a2e21:
        ::std::__cxx11::string::~string((string *)&sc_name);
        ts_1 = &sc_type_name;
      }
LAB_001a2e2b:
      ::std::__cxx11::string::~string((string *)ts_1);
      pSVar11 = (SPIRType *)CONCAT71((int7)((ulong)pSVar11 >> 8),1);
    }
LAB_001a2e33:
    pPVar14 = (ParsedIR *)
              ((long)&(local_1b8->pool_group)._M_t.
                      super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                      .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl + 4
              );
  }
  if (((ulong)pSVar11 & 1) != 0) {
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2a9b09);
  }
LAB_001a3386:
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&unique_func_constants._M_h);
  ParsedIR::LoopLock::~LoopLock(&loop_lock);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&aligned_structs._M_h);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&declared_structs._M_h);
  return;
}

Assistant:

void CompilerMSL::emit_specialization_constants_and_structs()
{
	SpecializationConstant wg_x, wg_y, wg_z;
	ID workgroup_size_id = get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);
	bool emitted = false;

	unordered_set<uint32_t> declared_structs;
	unordered_set<uint32_t> aligned_structs;

	// First, we need to deal with scalar block layout.
	// It is possible that a struct may have to be placed at an alignment which does not match the innate alignment of the struct itself.
	// In that case, if such a case exists for a struct, we must force that all elements of the struct become packed_ types.
	// This makes the struct alignment as small as physically possible.
	// When we actually align the struct later, we can insert padding as necessary to make the packed members behave like normally aligned types.
	ir.for_each_typed_id<SPIRType>([&](uint32_t type_id, const SPIRType &type) {
		if (type.basetype == SPIRType::Struct &&
		    has_extended_decoration(type_id, SPIRVCrossDecorationBufferBlockRepacked))
			mark_scalar_layout_structs(type);
	});

	bool builtin_block_type_is_required = false;
	// Very special case. If gl_PerVertex is initialized as an array (tessellation)
	// we have to potentially emit the gl_PerVertex struct type so that we can emit a constant LUT.
	ir.for_each_typed_id<SPIRConstant>([&](uint32_t, SPIRConstant &c) {
		auto &type = this->get<SPIRType>(c.constant_type);
		if (is_array(type) && has_decoration(type.self, DecorationBlock) && is_builtin_type(type))
			builtin_block_type_is_required = true;
	});

	// Very particular use of the soft loop lock.
	// align_struct may need to create custom types on the fly, but we don't care about
	// these types for purpose of iterating over them in ir.ids_for_type and friends.
	auto loop_lock = ir.create_loop_soft_lock();

	// Physical storage buffer pointers can have cyclical references,
	// so emit forward declarations of them before other structs.
	// Ignore type_id because we want the underlying struct type from the pointer.
	ir.for_each_typed_id<SPIRType>([&](uint32_t /* type_id */, const SPIRType &type) {
		if (type.basetype == SPIRType::Struct &&
			type.pointer && type.storage == StorageClassPhysicalStorageBuffer &&
			declared_structs.count(type.self) == 0)
		{
			statement("struct ", to_name(type.self), ";");
			declared_structs.insert(type.self);
			emitted = true;
		}
	});
	if (emitted)
		statement("");

	emitted = false;
	declared_structs.clear();

	// It is possible to have multiple spec constants that use the same spec constant ID.
	// The most common cause of this is defining spec constants in GLSL while also declaring
	// the workgroup size to use those spec constants. But, Metal forbids declaring more than
	// one variable with the same function constant ID.
	// In this case, we must only declare one variable with the [[function_constant(id)]]
	// attribute, and use its initializer to initialize all the spec constants with
	// that ID.
	std::unordered_map<uint32_t, ConstantID> unique_func_constants;

	for (auto &id_ : ir.ids_for_constant_undef_or_type)
	{
		auto &id = ir.ids[id_];

		if (id.get_type() == TypeConstant)
		{
			auto &c = id.get<SPIRConstant>();

			if (c.self == workgroup_size_id)
			{
				// TODO: This can be expressed as a [[threads_per_threadgroup]] input semantic, but we need to know
				// the work group size at compile time in SPIR-V, and [[threads_per_threadgroup]] would need to be passed around as a global.
				// The work group size may be a specialization constant.
				statement("constant uint3 ", builtin_to_glsl(BuiltInWorkgroupSize, StorageClassWorkgroup),
				          " [[maybe_unused]] = ", constant_expression(get<SPIRConstant>(workgroup_size_id)), ";");
				emitted = true;
			}
			else if (c.specialization)
			{
				auto &type = get<SPIRType>(c.constant_type);
				string sc_type_name = type_to_glsl(type);
				add_resource_name(c.self);
				string sc_name = to_name(c.self);

				// Function constants are only supported in MSL 1.2 and later.
				// If we don't support it just declare the "default" directly.
				// This "default" value can be overridden to the true specialization constant by the API user.
				// Specialization constants which are used as array length expressions cannot be function constants in MSL,
				// so just fall back to macros.
				if (msl_options.supports_msl_version(1, 2) && has_decoration(c.self, DecorationSpecId) &&
				    !c.is_used_as_array_length)
				{
					// Only scalar, non-composite values can be function constants.
					uint32_t constant_id = get_decoration(c.self, DecorationSpecId);
					if (!unique_func_constants.count(constant_id))
						unique_func_constants.insert(make_pair(constant_id, c.self));
					SPIRType::BaseType sc_tmp_type = expression_type(unique_func_constants[constant_id]).basetype;
					string sc_tmp_name = to_name(unique_func_constants[constant_id]) + "_tmp";
					if (unique_func_constants[constant_id] == c.self)
						statement("constant ", sc_type_name, " ", sc_tmp_name, " [[function_constant(", constant_id,
						          ")]];");
					statement("constant ", sc_type_name, " ", sc_name, " = is_function_constant_defined(", sc_tmp_name,
					          ") ? ", bitcast_expression(type, sc_tmp_type, sc_tmp_name), " : ", constant_expression(c),
					          ";");
				}
				else if (has_decoration(c.self, DecorationSpecId))
				{
					// Fallback to macro overrides.
					c.specialization_constant_macro_name =
					    constant_value_macro_name(get_decoration(c.self, DecorationSpecId));

					statement("#ifndef ", c.specialization_constant_macro_name);
					statement("#define ", c.specialization_constant_macro_name, " ", constant_expression(c));
					statement("#endif");
					statement("constant ", sc_type_name, " ", sc_name, " = ", c.specialization_constant_macro_name,
					          ";");
				}
				else
				{
					// Composite specialization constants must be built from other specialization constants.
					statement("constant ", sc_type_name, " ", sc_name, " = ", constant_expression(c), ";");
				}
				emitted = true;
			}
		}
		else if (id.get_type() == TypeConstantOp)
		{
			auto &c = id.get<SPIRConstantOp>();
			auto &type = get<SPIRType>(c.basetype);
			add_resource_name(c.self);
			auto name = to_name(c.self);
			statement("constant ", variable_decl(type, name), " = ", constant_op_expression(c), ";");
			emitted = true;
		}
		else if (id.get_type() == TypeType)
		{
			// Output non-builtin interface structs. These include local function structs
			// and structs nested within uniform and read-write buffers.
			auto &type = id.get<SPIRType>();
			TypeID type_id = type.self;

			bool is_struct = (type.basetype == SPIRType::Struct) && type.array.empty() && !type.pointer;
			bool is_block =
			    has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock);

			bool is_builtin_block = is_block && is_builtin_type(type);
			bool is_declarable_struct = is_struct && (!is_builtin_block || builtin_block_type_is_required);

			// We'll declare this later.
			if (stage_out_var_id && get_stage_out_struct_type().self == type_id)
				is_declarable_struct = false;
			if (patch_stage_out_var_id && get_patch_stage_out_struct_type().self == type_id)
				is_declarable_struct = false;
			if (stage_in_var_id && get_stage_in_struct_type().self == type_id)
				is_declarable_struct = false;
			if (patch_stage_in_var_id && get_patch_stage_in_struct_type().self == type_id)
				is_declarable_struct = false;

			// Special case. Declare builtin struct anyways if we need to emit a threadgroup version of it.
			if (stage_out_masked_builtin_type_id == type_id)
				is_declarable_struct = true;

			// Align and emit declarable structs...but avoid declaring each more than once.
			if (is_declarable_struct && declared_structs.count(type_id) == 0)
			{
				if (emitted)
					statement("");
				emitted = false;

				declared_structs.insert(type_id);

				if (has_extended_decoration(type_id, SPIRVCrossDecorationBufferBlockRepacked))
					align_struct(type, aligned_structs);

				// Make sure we declare the underlying struct type, and not the "decorated" type with pointers, etc.
				emit_struct(get<SPIRType>(type_id));
			}
		}
		else if (id.get_type() == TypeUndef)
		{
			auto &undef = id.get<SPIRUndef>();
			auto &type = get<SPIRType>(undef.basetype);
			// OpUndef can be void for some reason ...
			if (type.basetype == SPIRType::Void)
				return;

			// Undefined global memory is not allowed in MSL.
			// Declare constant and init to zeros. Use {}, as global constructors can break Metal.
			statement(
			    inject_top_level_storage_qualifier(variable_decl(type, to_name(undef.self), undef.self), "constant"),
			    " = {};");
			emitted = true;
		}
	}

	if (emitted)
		statement("");
}